

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_edit_draw_text(nk_command_buffer *out,nk_style_edit *style,float pos_x,float pos_y,
                      float x_offset,char *text,int byte_len,float row_height,nk_user_font *font,
                      nk_color background,nk_color foreground,nk_bool is_selected)

{
  nk_command_buffer *o;
  nk_style_edit *string;
  nk_style_edit *pnVar1;
  int iVar2;
  undefined4 in_register_0000000c;
  uint clen;
  ulong uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  float fVar14;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar15;
  float fVar16;
  undefined4 in_XMM3_Db;
  nk_rect rect;
  nk_rect b;
  nk_rect rect_00;
  nk_rect b_00;
  nk_rune unicode;
  int local_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  nk_color local_dc;
  uint local_d8;
  float local_d4;
  nk_command_buffer *local_d0;
  float local_c8;
  float fStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined8 local_b8;
  nk_style_edit *local_a8;
  nk_user_font *local_a0;
  ulong local_98;
  ulong local_90;
  float local_88;
  nk_text txt;
  
  local_a0 = (nk_user_font *)CONCAT44(in_register_0000000c,byte_len);
  clen = (uint)text;
  if (clen != 0 && style != (nk_style_edit *)0x0) {
    uVar3 = (ulong)text & 0xffffffff;
    unicode = 0;
    txt.padding.x = 0.0;
    txt.padding.y = 0.0;
    local_dc = SUB84(font,0);
    local_d4 = pos_y;
    local_d0 = out;
    local_88 = x_offset;
    txt.background = local_dc;
    txt.text = background;
    iVar2 = nk_utf_decode((char *)style,&unicode,clen);
    if (iVar2 != 0) {
      local_88 = local_88 + pos_x;
      local_c8 = 0.0;
      fStack_c4 = 0.0;
      uStack_c0 = 0;
      uStack_bc = 0;
      uVar12 = 0;
      local_fc = 0;
      local_d8 = clen;
      local_b8 = style;
      local_a8 = style;
      do {
        local_f8 = 0;
        uStack_f0 = 0;
        while( true ) {
          lVar5 = (long)(int)uVar12;
          lVar13 = lVar5 << 0x20;
          local_98 = (ulong)(uint)((int)uVar3 - (int)uVar12);
          iVar9 = -1;
          lVar8 = 0;
          local_90 = uVar12;
          while( true ) {
            pnVar1 = local_a8;
            string = local_b8;
            o = local_d0;
            iVar10 = (int)((ulong)lVar13 >> 0x20);
            iVar4 = (int)local_a8;
            iVar6 = (int)local_b8;
            if (((long)(int)clen <= lVar5 + lVar8) || (iVar2 == 0)) {
              if ((float)local_f8 <= 0.0) {
                return;
              }
              fVar14 = local_c8 + local_d4;
              if (local_fc == 0) {
                pos_x = local_88;
              }
              if (foreground != (nk_color)0x0) {
                rect_00.y = fVar14;
                rect_00.x = pos_x;
                uStack_f0 = CONCAT44(in_XMM3_Db,local_f8._4_4_);
                rect_00.w = (float)local_f8;
                rect_00.h = row_height;
                local_f8 = CONCAT44(row_height,(float)local_f8);
                local_c8 = pos_x;
                fStack_c4 = fVar14;
                uStack_c0 = in_XMM0_Dc;
                uStack_bc = in_XMM0_Dd;
                nk_fill_rect(local_d0,rect_00,0.0,local_dc);
                pos_x = local_c8;
                fVar14 = fStack_c4;
                row_height = local_f8._4_4_;
              }
              b_00.y = fVar14;
              b_00.x = pos_x;
              b_00.h = row_height;
              b_00.w = (float)local_f8;
              nk_widget_text(o,b_00,(char *)string,(iVar10 + iVar4) - iVar6,&txt,0x11,local_a0);
              return;
            }
            if (unicode != 0xd) break;
            iVar2 = nk_utf_decode((char *)((long)&(style->normal).type + lVar8 + lVar5 + 1),&unicode
                                  ,(int)local_98 + iVar9);
            lVar13 = lVar13 + 0x100000000;
            lVar8 = lVar8 + 1;
            iVar9 = iVar9 + -1;
          }
          iVar7 = (int)lVar8;
          if (unicode == 10) break;
          fVar14 = (*local_a0->width)(local_a0->userdata,local_a0->height,
                                      (char *)((long)&(local_a8->normal).type + (lVar13 >> 0x20)),
                                      iVar2);
          local_f8 = CONCAT44(local_f8._4_4_,(float)local_f8 + fVar14);
          uVar11 = (int)local_90 + iVar2 + iVar7;
          uVar12 = (ulong)uVar11;
          iVar2 = nk_utf_decode((char *)((long)&(pnVar1->normal).type + (long)(int)uVar11),&unicode,
                                ((int)local_98 - iVar2) - iVar7);
          uVar3 = (ulong)local_d8;
        }
        fVar16 = local_c8 + local_d4;
        fVar14 = pos_x;
        if (local_fc == 0) {
          fVar14 = local_88;
        }
        fVar15 = row_height;
        if (foreground != (nk_color)0x0) {
          local_b8 = (nk_style_edit *)CONCAT44(fVar16,fVar14);
          uStack_f0 = CONCAT44(in_XMM3_Db,local_f8._4_4_);
          rect.y = fVar16;
          rect.x = fVar14;
          rect.h = row_height;
          rect.w = (float)local_f8;
          local_f8 = CONCAT44(row_height,(float)local_f8);
          nk_fill_rect(local_d0,rect,0.0,local_dc);
          fVar15 = local_f8._4_4_;
          fVar14 = (float)local_b8;
          fVar16 = local_b8._4_4_;
        }
        b.y = fVar16;
        b.x = fVar14;
        b.h = fVar15;
        b.w = (float)local_f8;
        nk_widget_text(o,b,(char *)string,(iVar10 + iVar4) - iVar6,&txt,0x12,local_a0);
        uVar11 = (int)local_90 + iVar7 + 1;
        uVar12 = (ulong)uVar11;
        local_fc = local_fc + 1;
        local_b8 = (nk_style_edit *)((long)&(pnVar1->normal).type + (long)(int)uVar11);
        local_c8 = local_c8 + row_height;
        iVar2 = nk_utf_decode((char *)local_b8,&unicode,(int)local_98 + iVar9);
        uVar3 = (ulong)local_d8;
      } while( true );
    }
  }
  return;
}

Assistant:

NK_LIB void
nk_edit_draw_text(struct nk_command_buffer *out,
const struct nk_style_edit *style, float pos_x, float pos_y,
float x_offset, const char *text, int byte_len, float row_height,
const struct nk_user_font *font, struct nk_color background,
struct nk_color foreground, nk_bool is_selected)
{
NK_ASSERT(out);
NK_ASSERT(font);
NK_ASSERT(style);
if (!text || !byte_len || !out || !style) return;

{int glyph_len = 0;
nk_rune unicode = 0;
int text_len = 0;
float line_width = 0;
float glyph_width;
const char *line = text;
float line_offset = 0;
int line_count = 0;

struct nk_text txt;
txt.padding = nk_vec2(0,0);
txt.background = background;
txt.text = foreground;

glyph_len = nk_utf_decode(text+text_len, &unicode, byte_len-text_len);
if (!glyph_len) return;
while ((text_len < byte_len) && glyph_len)
{
if (unicode == '\n') {
/* new line separator so draw previous line */
struct nk_rect label;
label.y = pos_y + line_offset;
label.h = row_height;
label.w = line_width;
label.x = pos_x;
if (!line_count)
label.x += x_offset;

if (is_selected) /* selection needs to draw different background color */
nk_fill_rect(out, label, 0, background);
nk_widget_text(out, label, line, (int)((text + text_len) - line),
&txt, NK_TEXT_CENTERED, font);

text_len++;
line_count++;
line_width = 0;
line = text + text_len;
line_offset += row_height;
glyph_len = nk_utf_decode(text + text_len, &unicode, (int)(byte_len-text_len));
continue;
}
if (unicode == '\r') {
text_len++;
glyph_len = nk_utf_decode(text + text_len, &unicode, byte_len-text_len);
continue;
}
glyph_width = font->width(font->userdata, font->height, text+text_len, glyph_len);
line_width += (float)glyph_width;
text_len += glyph_len;
glyph_len = nk_utf_decode(text + text_len, &unicode, byte_len-text_len);
continue;
}
if (line_width > 0) {
/* draw last line */
struct nk_rect label;
label.y = pos_y + line_offset;
label.h = row_height;
label.w = line_width;
label.x = pos_x;
if (!line_count)
label.x += x_offset;

if (is_selected)
nk_fill_rect(out, label, 0, background);
nk_widget_text(out, label, line, (int)((text + text_len) - line),
&txt, NK_TEXT_LEFT, font);
}}
}